

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  value_type *pvVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  value_type vVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  value_type *pvVar15;
  ulong uVar16;
  value_type avStack_3e [14];
  char_type buffer [13];
  
  pvVar4 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar5 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar8 = it->blackhole_;
  uVar13 = (ulong)*(uint *)this;
  iVar1 = *(int *)(this + 4);
  lVar9 = (long)iVar1;
  pvVar15 = avStack_3e + lVar9 + 1;
  if (uVar13 < 100) {
    if (*(uint *)this < 10) goto LAB_0015a2d2;
    uVar14 = uVar13 * 2;
    avStack_3e[lVar9] = internal::basic_data<void>::DIGITS[uVar13 * 2 + 1];
LAB_0015a2eb:
    pvVar15 = pvVar15 + -1;
  }
  else {
    iVar6 = 0;
    do {
      uVar14 = uVar13;
      uVar11 = (uint)uVar14;
      uVar13 = uVar14 / 100;
      iVar12 = (int)(uVar14 / 100);
      uVar16 = (ulong)((uVar11 + iVar12 * -100) * 2);
      pvVar15[-1] = internal::basic_data<void>::DIGITS[uVar16 + 1];
      if (iVar6 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pvVar15 + -2) = this[8];
        pvVar15[-3] = internal::basic_data<void>::DIGITS[uVar16];
        if ((uint)((iVar6 + 2) * -0x55555555) < 0x55555556) {
          lVar7 = -4;
          goto LAB_0015a27d;
        }
        pvVar15 = pvVar15 + -3;
      }
      else {
        pvVar15[-2] = internal::basic_data<void>::DIGITS[uVar16];
        if ((uint)((iVar6 + 2) * -0x55555555) < 0x55555556) {
          lVar7 = -3;
LAB_0015a27d:
          *(num_writer *)(pvVar15 + lVar7) = this[8];
          pvVar15 = pvVar15 + lVar7;
        }
        else {
          pvVar15 = pvVar15 + -2;
        }
      }
      iVar6 = iVar6 + 2;
    } while (9999 < uVar11);
    if (uVar11 < 1000) {
LAB_0015a2d2:
      bVar10 = (byte)uVar13 | 0x30;
      goto LAB_0015a2fc;
    }
    uVar14 = (ulong)(uint)(iVar12 + (int)(uVar14 / 100));
    pvVar15[-1] = internal::basic_data<void>::DIGITS[uVar14 + 1];
    if (0x55555555 < iVar6 * -0x55555555 + 0xaaaaaaabU) goto LAB_0015a2eb;
    *(num_writer *)(pvVar15 + -2) = this[8];
    pvVar15 = pvVar15 + -2;
  }
  bVar10 = internal::basic_data<void>::DIGITS[uVar14 & 0xffffffff];
LAB_0015a2fc:
  pvVar15[-1] = bVar10;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      vVar3 = avStack_3e[lVar7 + 1];
      if (sVar5 + lVar7 < uVar2) {
        *pvVar4 = avStack_3e[lVar7 + 1];
        pvVar4 = pvVar4 + 1;
        vVar3 = vVar8;
      }
      vVar8 = vVar3;
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
    sVar5 = sVar5 + lVar9;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar4;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar5;
  it->blackhole_ = vVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }